

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  pointer pcVar1;
  double dVar2;
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  lzham_uint32 lVar7;
  lzham_compress_status_t lVar8;
  lzham_decompress_status_t lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  timer_ticks tVar13;
  FILE *pFVar14;
  __off64_t _Var15;
  __off64_t _Var16;
  timer_ticks tVar17;
  undefined1 recursive;
  char *pcVar18;
  string_array *files;
  ulong uVar19;
  allocator<char> *paVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  undefined8 uVar24;
  char *pcVar25;
  int iVar26;
  pointer pbVar27;
  iterator __position;
  ulong uVar28;
  bool bVar29;
  lzham_uint32 decomp_adler32;
  comp_options options;
  string seed_filename;
  size_t cmp_len;
  lzham_compress_params comp_params;
  size_t decomp_size;
  lzham_uint32 comp_adler32;
  lzham_decompress_params decomp_params;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  float local_97c;
  undefined1 local_978 [8];
  lzham_compress_level lStack_970;
  uint uStack_96c;
  bool bStack_968;
  bool bStack_967;
  bool bStack_966;
  bool bStack_965;
  bool bStack_964;
  bool bStack_963;
  bool bStack_962;
  undefined1 uStack_961;
  undefined3 uStack_960;
  undefined1 uStack_95d;
  uint uStack_95c;
  bool bStack_958;
  bool bStack_957;
  undefined1 uStack_956;
  undefined1 uStack_955;
  uint uStack_954;
  ilzham *local_950;
  timer local_948;
  ulong local_928;
  char *local_920;
  string local_918;
  long local_8f8;
  float local_8ec;
  undefined1 local_8e8 [16];
  bool local_8d8;
  bool bStack_8d7;
  bool bStack_8d6;
  bool bStack_8d5;
  bool bStack_8d4;
  bool bStack_8d3;
  undefined2 uStack_8d2;
  undefined4 uStack_8d0;
  uint uStack_8cc;
  bool bStack_8c8;
  bool bStack_8c7;
  undefined1 uStack_8c6;
  undefined1 uStack_8c5;
  uint uStack_8c4;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  size_t local_8a8;
  undefined5 uStack_8a0;
  undefined3 uStack_89b;
  undefined5 uStack_898;
  undefined1 local_888 [32];
  undefined1 local_868 [32];
  undefined8 local_848;
  timer_ticks local_840;
  undefined2 *local_838;
  undefined8 local_830;
  undefined2 local_828;
  undefined6 uStack_826;
  allocator<char> local_438 [1032];
  
  local_978._0_4_ = 4;
  local_978._4_4_ = 0x1c;
  lStack_970 = CONCAT31(lStack_970._1_3_,1);
  bStack_964 = false;
  bStack_963 = false;
  bStack_962 = false;
  bStack_968 = false;
  bStack_967 = false;
  bStack_966 = false;
  bStack_965 = false;
  pcVar18 = (char *)0x400000008;
  recursive = 8;
  uStack_960 = 8;
  uStack_95d = 0;
  uStack_95c = 4;
  bStack_958 = false;
  bStack_957 = false;
  uStack_954 = 0;
  uStack_96c = num_helper_threads;
  if ((cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    bStack_8d4 = false;
    bStack_8d3 = false;
    uStack_8d2._0_1_ = false;
    uStack_8d2._1_1_ = 0;
    uStack_8d0 = 0;
    uStack_8cc = 0;
    bStack_8c8 = false;
    bStack_8c7 = false;
    uStack_8c6 = 0;
    uStack_8c5 = 0;
    uStack_8c4 = 0;
    uStack_8c0._0_4_ = 0;
    uStack_8c0._4_4_ = 0;
    local_8b8._0_4_ = 0;
    local_8b8._4_4_ = 0;
    local_8e8._0_4_ = 0x38;
    local_8e8._4_4_ = 0x1a;
    local_8e8._8_4_ = LZHAM_COMP_LEVEL_UBER;
    local_8e8._12_4_ = 0;
    local_8d8 = true;
    bStack_8d7 = false;
    bStack_8d6 = false;
    bStack_8d5 = false;
    local_918._M_dataplus._M_p = (pointer)0x400;
    local_888._0_8_ = (ulong)(uint)local_888._4_4_ << 0x20;
    lVar8 = (*lzham_dll->lzham_compress_memory)
                      ((lzham_compress_params *)local_8e8,(lzham_uint8 *)&local_838,
                       (size_t *)&local_918,
                       (lzham_uint8 *)
                       "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                       ,0x58,(lzham_uint32 *)local_888);
    if (lVar8 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      print_error("Compression test failed with status %i!\n",(ulong)lVar8);
      return 1;
    }
    printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,
           (ulong)local_918._M_dataplus._M_p & 0xffffffff);
    local_868._8_8_ = 0;
    local_868._16_8_ = 0;
    local_868._24_8_ = (void *)0x0;
    local_848._0_4_ = 0;
    local_848._4_4_ = 0;
    local_868._4_4_ = local_8e8._4_4_;
    local_868._0_4_ = 0x28;
    if ((bool)(undefined1)lStack_970 == true) {
      local_868._8_8_ = 0x200000000;
    }
    local_8a8 = 0x400;
    local_97c = 0.0;
    timer::timer(&local_948);
    timer::start(&local_948);
    bVar29 = true;
    do {
      bVar4 = bVar29;
      if (!bVar4) goto LAB_001046a1;
      lVar9 = (*lzham_dll->lzham_decompress_memory)
                        ((lzham_decompress_params *)local_868,(lzham_uint8 *)local_438,&local_8a8,
                         (lzham_uint8 *)&local_838,(size_t)local_918._M_dataplus._M_p,
                         (lzham_uint32 *)&local_97c);
      if (lVar9 != LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        print_error("Compression test failed with status %i!\n",(ulong)lVar9);
        goto LAB_00104696;
      }
      if (((float)local_888._0_4_ != local_97c) || (local_8a8 != 0x58)) break;
      iVar10 = bcmp(local_438,
                    "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                    ,0x58);
      bVar29 = false;
    } while (iVar10 == 0);
    print_error("Compression test failed!\n");
LAB_00104696:
    if (bVar4) {
      return 1;
    }
LAB_001046a1:
    dVar2 = timer::get_elapsed_secs(&local_948);
    printf("Decompress time: %3.6f secs\n",SUB84(dVar2,0));
    puts("Compression test succeeded.");
    return 0;
  }
  local_948.m_start_time = (timer_ticks)&local_948.field_0x10;
  local_948.m_stop_time = 0;
  local_948._16_1_ = 0;
  pbVar27 = (cmd_line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_950 = lzham_dll;
  if ((int)((ulong)((long)(cmd_line->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27) >> 5) < 1) {
    bVar29 = true;
    iVar10 = -1;
  }
  else {
    iVar10 = -1;
    iVar21 = 0;
    do {
      tVar17 = local_948.m_stop_time;
      pcVar25 = pbVar27[iVar21]._M_dataplus._M_p;
      __position._M_current = pbVar27 + iVar21;
      if (*pcVar25 == 0x2d) {
        if ((__position._M_current)->_M_string_length < 2) {
switchD_001038cc_caseD_6:
          pcVar25 = "Invalid option: %s\n";
LAB_0010399a:
          print_error(pcVar25);
          goto LAB_001039a4;
        }
        pcVar18 = (char *)(ulong)((byte)pcVar25[1] - 0x61);
        uVar11 = uStack_96c;
        switch(pcVar18) {
        case (char *)0x0:
          pcVar18 = pcVar25 + 2;
          strlen(pcVar18);
          std::__cxx11::string::_M_replace((ulong)&local_948,0,(char *)tVar17,(ulong)pcVar18);
          if ((char *)local_948.m_stop_time == (char *)0x0) {
            pcVar25 = "Must specify seed filename with -a option!\n";
            goto LAB_0010397b;
          }
          printf("Seed filename: %s\n",local_948.m_start_time);
          uVar11 = uStack_96c;
          break;
        case (char *)0x1:
          bStack_958 = true;
          break;
        case (char *)0x2:
          lStack_970 = lStack_970 & 0xffffff00;
          break;
        case (char *)0x3:
          lVar7 = atoi(pcVar25 + 2);
          if (lVar7 - 0xf < 0xf) {
            local_978._4_4_ = lVar7;
            uVar11 = uStack_96c;
            break;
          }
          print_error("Invalid dictionary size: %s\n");
          iVar6 = 1;
          goto LAB_00103b17;
        case (char *)0x4:
          bStack_964 = true;
          break;
        case (char *)0x5:
          uStack_954 = atoi(pcVar25 + 2);
          uVar11 = uStack_96c;
          break;
        case (char *)0x6:
        case (char *)0x9:
        case (char *)0xa:
        case (char *)0xb:
        case (char *)0xd:
        case (char *)0xf:
        case (char *)0x10:
        case (char *)0x16:
          goto switchD_001038cc_caseD_6;
        case (char *)0x7:
          uVar11 = atoi(pcVar25 + 2);
          if (0x14 < uVar11) {
            print_error("Invalid table update rate: %s\n");
            iVar6 = 1;
            goto LAB_00103b17;
          }
          uStack_960 = (undefined3)uVar11;
          uStack_95d = (undefined1)(uVar11 >> 0x18);
          uVar11 = uStack_96c;
          break;
        case (char *)0x8:
          bStack_962 = true;
          bStack_964 = true;
          break;
        case (char *)0xc:
          uVar11 = atoi(pcVar25 + 2);
          if (4 < uVar11) {
            print_error("Invalid compression level: %s\n");
            iVar6 = 1;
            goto LAB_00103b17;
          }
          local_978._0_4_ = uVar11;
          uVar11 = uStack_96c;
          break;
        case (char *)0xe:
          bStack_963 = true;
          break;
        case (char *)0x11:
          bStack_966 = true;
          break;
        case (char *)0x12:
          uVar11 = atoi(pcVar25 + 2);
          srand(uVar11);
          printf("Using random seed: %i\n",(ulong)uVar11);
          uVar11 = uStack_96c;
          break;
        case (char *)0x13:
          uVar11 = atoi(pcVar25 + 2);
          if (0x40 < uVar11) {
            print_error("Invalid number of helper threads: %s\n");
            iVar6 = 1;
            goto LAB_00103b17;
          }
          break;
        case (char *)0x14:
          bStack_968 = true;
          break;
        case (char *)0x15:
          bStack_967 = true;
          break;
        case (char *)0x17:
          bStack_965 = true;
          pcVar1 = ((__position._M_current)->_M_dataplus)._M_p;
          if (pcVar1[2] != '\0') {
            uStack_95c = atoi(pcVar1 + 2);
            uVar11 = uStack_96c;
          }
          break;
        default:
          if (pcVar25[1] != 0x46) goto switchD_001038cc_caseD_6;
          bStack_957 = true;
        }
        uStack_96c = uVar11;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(cmd_line,(cmd_line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + iVar21);
        iVar21 = iVar21 + -1;
        iVar6 = 4;
      }
      else {
        if ((bStack_968 != true) || ((char *)local_948.m_stop_time == (char *)0x0)) {
          if ((__position._M_current)->_M_string_length == 1) {
            iVar6 = tolower((int)*pcVar25);
            if (iVar6 == 0x61) {
              iVar26 = 2;
            }
            else {
              iVar26 = 0;
              if (iVar6 != 99) {
                if (iVar6 != 100) goto LAB_0010396b;
                iVar26 = 1;
              }
            }
            iVar6 = 2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase(cmd_line,__position);
            iVar10 = iVar26;
            goto LAB_00103b17;
          }
LAB_0010396b:
          pcVar25 = "Invalid mode: %s\n";
          goto LAB_0010399a;
        }
        pcVar25 = "Unbuffered decompression is not compatible with seed files!\n";
LAB_0010397b:
        print_error(pcVar25);
LAB_001039a4:
        iVar6 = 1;
      }
LAB_00103b17:
      recursive = SUB81(pcVar18,0);
      if (iVar6 != 4) goto LAB_00103d7f;
      iVar21 = iVar21 + 1;
      pbVar27 = (cmd_line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (iVar21 < (int)((ulong)((long)(cmd_line->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pbVar27) >> 5));
    iVar6 = 2;
LAB_00103d7f:
    bVar29 = iVar6 == 2;
  }
  uVar22 = 1;
  uVar11 = uVar22;
  if (!bVar29) goto LAB_00104703;
  if (iVar10 == -1) {
    print_error("No mode specified!\n");
    print_usage();
    goto LAB_00104703;
  }
  puts("Using options:");
  comp_options::print((comp_options *)local_978);
  putchar(10);
  bVar29 = bStack_966;
  pbVar27 = (cmd_line->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27;
  if (iVar10 == 2) {
    if ((long)uVar12 >> 5 == 1) {
      pcVar18 = (pbVar27->_M_dataplus)._M_p;
      local_888._16_2_ = CONCAT11(bStack_967,bStack_968);
      local_888._12_4_ = uStack_96c;
      local_888._8_4_ = lStack_970;
      local_888._0_8_ = local_978;
      uStack_898 = CONCAT41(uStack_954,uStack_955);
      local_8a8 = CONCAT44(_uStack_961,
                           CONCAT13(bStack_962,CONCAT12(bStack_963,CONCAT11(bStack_964,bStack_965)))
                          );
      uStack_8a0 = CONCAT41(uStack_95c,uStack_95d);
      uStack_89b = (undefined3)
                   (CONCAT17(uStack_956,CONCAT16(bStack_957,CONCAT15(bStack_958,uStack_8a0))) >>
                   0x28);
      local_920 = (char *)local_948.m_stop_time;
      if ((char *)local_948.m_stop_time != (char *)0x0) {
        local_920 = (char *)local_948.m_start_time;
      }
      local_918._M_dataplus._M_p = (pointer)0x0;
      local_918._M_string_length = 0;
      local_918.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_868,pcVar18,local_438);
      local_828 = 0x2a;
      local_830 = 1;
      local_838 = &local_828;
      bVar4 = find_files((string *)local_868,&local_918,files,(bool)recursive);
      if (local_838 != &local_828) {
        operator_delete(local_838,CONCAT62(uStack_826,local_828) + 1);
      }
      if ((undefined1 *)local_868._0_8_ != local_868 + 0x10) {
        operator_delete((void *)local_868._0_8_,local_868._16_8_ + 1);
      }
      if (bVar4) {
        tVar17 = timer::get_ticks();
        tVar13 = timer::get_init_ticks();
        local_840 = tVar17;
        sprintf((char *)&local_838,"__comp_temp_%u__.tmp",tVar13 & 0xffffffff);
        sprintf((char *)local_438,"__decomp_temp_%u__.tmp",tVar13 & 0xffffffff);
        bVar4 = local_918._M_string_length - (long)local_918._M_dataplus._M_p == 0;
        if (bVar4) {
          local_928 = 0;
          local_8f8 = 0;
          local_918.field_2._8_8_ = 0;
        }
        else {
          uVar19 = (long)(local_918._M_string_length - (long)local_918._M_dataplus._M_p) >> 5;
          bVar4 = false;
          local_928 = 0;
          local_918.field_2._8_8_ = 0;
          local_8f8 = 0;
          uVar12 = 0;
          uVar28 = 1;
          do {
            _Var3._M_p = local_918._M_dataplus._M_p;
            lVar23 = uVar12 * 0x20;
            pcVar1 = local_918._M_dataplus._M_p + lVar23;
            printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",uVar28,uVar19,
                   *(undefined8 *)(local_918._M_dataplus._M_p + lVar23),
                   (allocator<char> *)&local_838);
            pFVar14 = fopen64(*(char **)(_Var3._M_p + lVar23),"rb");
            if (pFVar14 == (FILE *)0x0) {
              printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar1);
LAB_001043ad:
              bVar5 = false;
            }
            else {
              fseek(pFVar14,0,2);
              _Var15 = ftello64(pFVar14);
              if (_Var15 != 0) {
                fseek(pFVar14,0,0);
                iVar10 = fgetc(pFVar14);
                if (iVar10 == -1) {
                  printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar1);
                  fclose(pFVar14);
                  goto LAB_001043ad;
                }
              }
              fclose(pFVar14);
              bVar5 = ensure_file_is_writable((char *)&local_838);
              paVar20 = (allocator<char> *)&local_838;
              if (bVar5) {
                local_8d8 = SUB21(local_888._16_2_,0);
                bStack_8d7 = SUB21(local_888._16_2_,1);
                local_8e8._0_8_ = local_888._0_8_;
                local_8e8._8_8_ = local_888._8_8_;
                bStack_8d6 = bVar29;
                uStack_8c5 = (undefined1)uStack_898;
                uStack_8c4 = (uint)((uint5)uStack_898 >> 8);
                bStack_8d5 = SUB81(local_8a8,0);
                bStack_8d4 = SUB81(local_8a8 >> 8,0);
                bStack_8d3 = SUB81(local_8a8 >> 0x10,0);
                uStack_8d2 = (undefined2)(local_8a8 >> 0x18);
                uStack_8d0._0_3_ = (undefined3)(local_8a8 >> 0x28);
                uStack_8d0._3_1_ = (undefined1)uStack_8a0;
                uStack_8cc = (uint)((uint5)uStack_8a0 >> 8);
                bStack_8c8 = SUB31(uStack_89b,0);
                bStack_8c7 = SUB31((uint3)uStack_89b >> 8,0);
                uStack_8c6 = (undefined1)((uint3)uStack_89b >> 0x10);
                if ((bVar29 & 1U) != 0) {
                  bVar5 = local_920 == (char *)0x0;
                  uVar11 = rand();
                  local_8e8._0_4_ = uVar11 % 5;
                  iVar10 = rand();
                  local_8e8._4_4_ = iVar10 % 0xf + 0xf;
                  iVar10 = rand();
                  local_8e8._12_4_ = iVar10 % 0x41;
                  iVar10 = rand();
                  local_8d8 = (bool)((byte)iVar10 & bVar5);
                  iVar10 = rand();
                  bStack_8d4 = (bool)((byte)iVar10 & 1);
                  iVar10 = rand();
                  bStack_8d3 = (bool)((byte)iVar10 & 1);
                  iVar10 = rand();
                  uStack_8d0 = iVar10 % 0x13 + 2;
                  iVar10 = rand();
                  uStack_8cc = iVar10 % 7 + 2;
                  iVar10 = rand();
                  bStack_8c8 = (bool)((byte)iVar10 & 1);
                  iVar10 = rand();
                  bStack_8c7 = (bool)((byte)iVar10 & 1);
                  iVar10 = rand();
                  uStack_8c4 = iVar10 % 0xfb + 8;
                  comp_options::print((comp_options *)local_8e8);
                }
                local_97c = 0.0;
                local_8ec = 0.0;
                bVar5 = compress_file(local_950,*(char **)pcVar1,(char *)&local_838,
                                      (comp_options *)local_8e8,local_920,&local_97c);
                if (bVar5) {
                  if (bStack_8d7 != true) {
LAB_00104346:
                    pFVar14 = fopen64((char *)&local_838,"rb");
                    if (pFVar14 == (FILE *)0x0) {
                      _Var16 = 0;
                    }
                    else {
                      fseek(pFVar14,0,2);
                      _Var16 = ftello64(pFVar14);
                      fclose(pFVar14);
                    }
                    local_8f8 = local_8f8 + _Var16;
                    local_918.field_2._8_8_ = local_918.field_2._8_8_ + _Var15;
                    local_928 = (ulong)((int)local_928 + 1);
                    putchar(10);
                    bVar5 = false;
                    goto LAB_001043e5;
                  }
                  printf("Decompressing file \"%s\" to \"%s\"\n",(allocator<char> *)&local_838,
                         local_438);
                  bVar5 = ensure_file_is_writable((char *)local_438);
                  if (!bVar5) {
                    paVar20 = local_438;
                    goto LAB_00104443;
                  }
                  options_01.m_low_memory_finder = bStack_8c7;
                  options_01.m_force_single_threaded_parsing = bStack_8c8;
                  options_01._34_1_ = uStack_8c6;
                  options_01._35_1_ = uStack_8c5;
                  options_01.m_fast_bytes = uStack_8c4;
                  options_01.m_verify_compressed_data = bStack_8d7;
                  options_01.m_unbuffered_decompression = local_8d8;
                  options_01.m_randomize_params = bStack_8d6;
                  options_01.m_extreme_parsing = bStack_8d5;
                  options_01.m_deterministic_parsing = bStack_8d4;
                  options_01.m_tradeoff_decomp_rate_for_comp_ratio = bStack_8d3;
                  options_01.m_test_compressor_reinit = uStack_8d2._0_1_;
                  options_01._23_1_ = uStack_8d2._1_1_;
                  options_01.m_max_best_arrivals = uStack_8cc;
                  options_01.m_table_update_rate = uStack_8d0;
                  options_01.m_compute_adler32_during_decomp = (bool)local_8e8[8];
                  options_01._9_3_ = local_8e8._9_3_;
                  options_01.m_max_helper_threads = local_8e8._12_4_;
                  options_01.m_comp_level = local_8e8._0_4_;
                  options_01.m_dict_size_log2 = local_8e8._4_4_;
                  bVar5 = decompress_file(local_950,(char *)&local_838,(char *)local_438,options_01,
                                          local_920,&local_8ec);
                  uVar24 = *(undefined8 *)pcVar1;
                  if (bVar5) {
                    printf("Comparing file \"%s\" to \"%s\"\n",local_438);
                    bVar5 = compare_files((char *)local_438,*(char **)pcVar1);
                    if (bVar5) {
                      puts("Decompressed file compared OK to original file.");
                      goto LAB_00104346;
                    }
                    uVar24 = *(undefined8 *)pcVar1;
                    pcVar18 = 
                    "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
                  }
                  else {
                    pcVar18 = "Failed decompressing file \"%s\" to \"%s\"\n";
                    paVar20 = local_438;
                  }
                }
                else {
                  uVar24 = *(undefined8 *)pcVar1;
                  pcVar18 = "Failed compressing file \"%s\" to \"%s\"\n";
                }
                print_error(pcVar18,uVar24,paVar20);
              }
              else {
LAB_00104443:
                print_error("Unable to create file \"%s\"!\n",paVar20);
              }
              bVar5 = true;
            }
LAB_001043e5:
            if (bVar5) break;
            uVar19 = (long)(local_918._M_string_length - (long)local_918._M_dataplus._M_p) >> 5;
            bVar4 = uVar19 <= uVar28;
            bVar5 = uVar28 < uVar19;
            uVar12 = uVar28;
            uVar28 = (ulong)((int)uVar28 + 1);
          } while (bVar5);
        }
        if (bVar4) {
          tVar17 = timer::get_ticks();
          dVar2 = timer::ticks_to_secs(tVar17 - local_840);
          uVar12 = local_928;
          printf("Test successful: %f secs\n",SUB84(dVar2,0));
          printf("Total files processed: %u\n",uVar12 & 0xffffffff);
          printf("Total source size: %llu\n",local_918.field_2._8_8_);
          printf("Total compressed size: %llu\n",local_8f8);
          remove((char *)&local_838);
          remove((char *)local_438);
        }
        uVar11 = (uint)(byte)~bVar4;
      }
      else {
        print_error("Failed finding files under path \"%s\"!\n",pcVar18);
        uVar11 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_918);
      goto LAB_00104703;
    }
    if ((long)uVar12 >> 5 != 0) goto LAB_001046f5;
    pcVar18 = "No directory specified!\n";
  }
  else {
    if (iVar10 == 1) {
      if (uVar12 < 0x21) {
LAB_001046de:
        pcVar18 = "Must specify input and output filenames!\n";
        goto LAB_001046fc;
      }
      if (uVar12 == 0x40) {
        pbVar27 = (cmd_line->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar18 = (char *)local_948.m_stop_time;
        if ((char *)local_948.m_stop_time != (char *)0x0) {
          pcVar18 = (char *)local_948.m_start_time;
        }
        options_00.m_low_memory_finder = bStack_957;
        options_00.m_force_single_threaded_parsing = bStack_958;
        options_00._34_1_ = uStack_956;
        options_00._35_1_ = uStack_955;
        options_00.m_fast_bytes = uStack_954;
        options_00.m_max_helper_threads = uStack_96c;
        options_00._8_4_ = lStack_970;
        options_00.m_verify_compressed_data = bStack_967;
        options_00.m_unbuffered_decompression = bStack_968;
        options_00.m_randomize_params = bStack_966;
        options_00.m_extreme_parsing = bStack_965;
        options_00.m_deterministic_parsing = bStack_964;
        options_00.m_tradeoff_decomp_rate_for_comp_ratio = bStack_963;
        options_00.m_test_compressor_reinit = bStack_962;
        options_00._23_1_ = uStack_961;
        options_00.m_table_update_rate._3_1_ = uStack_95d;
        options_00.m_table_update_rate._0_3_ = uStack_960;
        options_00.m_max_best_arrivals = uStack_95c;
        options_00.m_comp_level = local_978._0_4_;
        options_00.m_dict_size_log2 = local_978._4_4_;
        bVar29 = decompress_file(local_950,(pbVar27->_M_dataplus)._M_p,pbVar27[1]._M_dataplus._M_p,
                                 options_00,pcVar18,(float *)0x0);
        uVar11 = (uint)!bVar29;
        goto LAB_00104703;
      }
    }
    else {
      if (uVar12 < 0x21) goto LAB_001046de;
      if (uVar12 == 0x40) {
        pcVar18 = (char *)local_948.m_stop_time;
        if ((char *)local_948.m_stop_time != (char *)0x0) {
          pcVar18 = (char *)local_948.m_start_time;
        }
        bVar29 = compress_file(local_950,(pbVar27->_M_dataplus)._M_p,pbVar27[1]._M_dataplus._M_p,
                               (comp_options *)local_978,pcVar18,(float *)0x0);
        uVar11 = (uint)!bVar29;
        if ((bVar29) && (bStack_967 == true)) {
          tVar17 = timer::get_ticks();
          dVar2 = timer::ticks_to_secs(tVar17);
          sprintf((char *)&local_838,"__decomp_temp_%u__.tmp",(long)(dVar2 * 1000.0));
          pcVar18 = (char *)local_948.m_stop_time;
          if ((char *)local_948.m_stop_time != (char *)0x0) {
            pcVar18 = (char *)local_948.m_start_time;
          }
          options_02.m_low_memory_finder = bStack_957;
          options_02.m_force_single_threaded_parsing = bStack_958;
          options_02._34_1_ = uStack_956;
          options_02._35_1_ = uStack_955;
          options_02.m_fast_bytes = uStack_954;
          options_02.m_max_helper_threads = uStack_96c;
          options_02._8_4_ = lStack_970;
          options_02.m_verify_compressed_data = bStack_967;
          options_02.m_unbuffered_decompression = bStack_968;
          options_02.m_randomize_params = bStack_966;
          options_02.m_extreme_parsing = bStack_965;
          options_02.m_deterministic_parsing = bStack_964;
          options_02.m_tradeoff_decomp_rate_for_comp_ratio = bStack_963;
          options_02.m_test_compressor_reinit = bStack_962;
          options_02._23_1_ = uStack_961;
          options_02.m_table_update_rate._3_1_ = uStack_95d;
          options_02.m_table_update_rate._0_3_ = uStack_960;
          options_02.m_max_best_arrivals = uStack_95c;
          options_02.m_comp_level = local_978._0_4_;
          options_02.m_dict_size_log2 = local_978._4_4_;
          bVar29 = decompress_file(local_950,pbVar27[1]._M_dataplus._M_p,(char *)&local_838,
                                   options_02,pcVar18,(float *)0x0);
          if (bVar29) {
            printf("Comparing file \"%s\" to \"%s\"\n",&local_838,(pbVar27->_M_dataplus)._M_p);
            bVar29 = compare_files((char *)&local_838,(pbVar27->_M_dataplus)._M_p);
            if (bVar29) {
              puts("Decompressed file compared OK to original file.");
              remove((char *)&local_838);
            }
            else {
              print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
                          ,(pbVar27->_M_dataplus)._M_p,pbVar27[1]._M_dataplus._M_p);
              uVar11 = uVar22;
            }
          }
          else {
            pcVar18 = (char *)local_948.m_stop_time;
            if ((char *)local_948.m_stop_time != (char *)0x0) {
              pcVar18 = (char *)local_948.m_start_time;
            }
            print_error("Failed decompressing file \"%s\" to \"%s\"\n",pbVar27[1]._M_dataplus._M_p,
                        &local_838,pcVar18);
            uVar11 = uVar22;
          }
        }
        goto LAB_00104703;
      }
    }
LAB_001046f5:
    pcVar18 = "Too many filenames!\n";
  }
LAB_001046fc:
  print_error(pcVar18);
LAB_00104703:
  if ((undefined1 *)local_948.m_start_time != &local_948.field_0x10) {
    operator_delete((void *)local_948.m_start_time,CONCAT71(local_948._17_7_,local_948._16_1_) + 1);
  }
  return uVar11;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;
   std::string seed_filename;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (str[1])
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
				case 'h':
				{
					int update_rate = atoi(str.c_str() + 2);
					if ((update_rate < 0) || (update_rate > LZHAM_FASTEST_TABLE_UPDATE_RATE))
					{
						print_error("Invalid table update rate: %s\n", str.c_str());
						return EXIT_FAILURE;
					}
					options.m_table_update_rate = update_rate;
					break;
				}
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;

               if (str[2])
               {
                  options.m_max_best_arrivals = atoi(str.c_str() + 2);
               }

               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 'o':
            {
               options.m_tradeoff_decomp_rate_for_comp_ratio = true;
               break;
            }
            case 'i':
            {
               options.m_test_compressor_reinit = true;
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            case 'a':
            {
               seed_filename = str.c_str() + 2;
               if (seed_filename.empty())
               {
                  print_error("Must specify seed filename with -a option!\n");
                  return EXIT_FAILURE;
               }
               printf("Seed filename: %s\n", seed_filename.c_str());
               break;
            }
            case 'b':
            {
               options.m_force_single_threaded_parsing = true;
               break;
            }
            case 'F':
            {
               options.m_low_memory_finder = true;
               break;
            }
            case 'f':
            {
               options.m_fast_bytes = atoi(str.c_str() + 2);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if ((options.m_unbuffered_decompression) && (!seed_filename.empty()))
      {
         print_error("Unbuffered decompression is not compatible with seed files!\n");
         return EXIT_FAILURE;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_file(lzham_dll, src_file.c_str(), cmp_file.c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options, seed_filename.length() ? seed_filename.c_str() : NULL))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file, seed_filename.length() ? seed_filename.c_str() : NULL);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         for (uint i = 0; i < 1; i++)
         {
            if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
               exit_status = EXIT_SUCCESS;
            else
               break;
         }
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

#if 0
			file_stats_vec stats;

         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL, &stats, 1, 1024*1024*512))
				exit_status = EXIT_SUCCESS;

			FILE *pFile = fopen("stats.csv", "w");
			if (pFile)
			{
				const float cpu_slowdown = 12.0f;
				float low_bps = 10000.0f;
				float scale_bps = 3125000.0f / 5.0f;
				//const float low_bps = 10000.0f / 10.0f;
				//const float scale_bps = 3125000.0f / 10.0f;

				for (uint i = 0; i < stats.size(); i++)
				{
					fprintf(pFile, "%s, %" PRIi64 ", , %" PRIi64 ", %f, %f, %f, , %" PRIi64 ", %f, %f, %f",
						stats[i].m_filename.c_str(),
						stats[i].m_size,
						stats[i].m_lzma_size, ((1.0f - (static_cast<float>(stats[i].m_lzma_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzma_comp_time, stats[i].m_lzma_decomp_time,
						stats[i].m_lzham_size, ((1.0f - (static_cast<float>(stats[i].m_lzham_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzham_comp_time, stats[i].m_lzham_decomp_time);

#if 0
					fprintf(pFile, ",");
					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzma_size / bps;
						float decomp_time = stats[i].m_lzma_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzham_size / bps;
						float decomp_time = stats[i].m_lzham_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_miniz_size / bps;
						float decomp_time = stats[i].m_miniz_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_size / bps;
						float decomp_time = 0.0f;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lz4_size / bps;
						float decomp_time = stats[i].m_lz4_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}
#endif

					fprintf(pFile, "\n");
				}

#if 0
				for (uint j = 0; j < 64; j++)
				{
					fprintf(pFile, "%3.2f, ",  (low_bps + (j * scale_bps)) / 8.0f / (1024.0f * 1024.0f));
				}
#endif

				fclose(pFile);
			}
#else
			if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
				exit_status = EXIT_SUCCESS;
#endif

         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}